

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_frameHeaderSize_internal(void *src,size_t srcSize,ZSTD_format_e format)

{
  byte bVar1;
  size_t sVar2;
  
  sVar2 = ZSTD_startingInputLength(format);
  if (srcSize < sVar2) {
    sVar2 = 0xffffffffffffffb8;
  }
  else {
    bVar1 = *(byte *)((long)src + (sVar2 - 1));
    sVar2 = sVar2 + ZSTD_did_fieldSize[bVar1 & 3] +
            *(long *)((long)ZSTD_fcs_fieldSize + (ulong)(bVar1 >> 3 & 0x18)) +
            (ulong)((bVar1 & 0x20) == 0) + (ulong)(bVar1 < 0x40 & (byte)((bVar1 & 0x20) >> 5));
  }
  return sVar2;
}

Assistant:

static size_t ZSTD_frameHeaderSize_internal(const void* src, size_t srcSize, ZSTD_format_e format)
{
    size_t const minInputSize = ZSTD_startingInputLength(format);
    RETURN_ERROR_IF(srcSize < minInputSize, srcSize_wrong, "");

    {   BYTE const fhd = ((const BYTE*)src)[minInputSize-1];
        U32 const dictID= fhd & 3;
        U32 const singleSegment = (fhd >> 5) & 1;
        U32 const fcsId = fhd >> 6;
        return minInputSize + !singleSegment
             + ZSTD_did_fieldSize[dictID] + ZSTD_fcs_fieldSize[fcsId]
             + (singleSegment && !fcsId);
    }
}